

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O0

RealType __thiscall
OpenMD::SC::getSuggestedCutoffRadius(SC *this,pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> atypes)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  reference this_00;
  reference pvVar5;
  AtomType *in_RDX;
  AtomType *in_RSI;
  long in_RDI;
  int *sctid2;
  int *sctid1;
  int atid2;
  int atid1;
  RealType local_8;
  
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    initialize((SC *)in_RDX);
  }
  iVar1 = AtomType::getIdent(in_RSI);
  iVar2 = AtomType::getIdent(in_RDX);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)iVar1);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)iVar2);
  if ((*pvVar3 == -1) || (*pvVar4 == -1)) {
    local_8 = 0.0;
  }
  else {
    this_00 = std::
              vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
              ::operator[]((vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                            *)(in_RDI + 0x90),(long)*pvVar3);
    pvVar5 = std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>::
             operator[](this_00,(long)*pvVar4);
    local_8 = pvVar5->rCut;
  }
  return local_8;
}

Assistant:

RealType SC::getSuggestedCutoffRadius(pair<AtomType*, AtomType*> atypes) {
    if (!initialized_) initialize();

    int atid1   = atypes.first->getIdent();
    int atid2   = atypes.second->getIdent();
    int& sctid1 = SCtids[atid1];
    int& sctid2 = SCtids[atid2];

    if (sctid1 == -1 || sctid2 == -1) {
      return 0.0;
    } else {
      return MixingMap[sctid1][sctid2].rCut;
    }
  }